

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_bonsai_nlm.hpp
# Opt level: O1

value_type_conflict7 * __thiscall
poplar::compact_bonsai_nlm<int,_8UL>::insert
          (compact_bonsai_nlm<int,_8UL> *this,uint64_t pos,char_range *key)

{
  byte *pbVar1;
  pointer puVar2;
  tuple<unsigned_char_*,_std::default_delete<unsigned_char[]>_> tVar3;
  bool bVar4;
  unsigned_long uVar5;
  long lVar6;
  __uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true> __s;
  __uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true> _Var7;
  uint uVar8;
  unsigned_long uVar9;
  unsigned_long uVar10;
  uint8_t *puVar11;
  uint8_t *puVar12;
  ulong chunk_id;
  uint8_t *puVar13;
  uint8_t *puVar14;
  value_type_conflict7 *pvVar15;
  pair<unsigned_long,_unsigned_long> pVar16;
  
  chunk_id = pos >> 3;
  uVar8 = (uint)pos & 7;
  pbVar1 = (this->chunks_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_start + chunk_id;
  *pbVar1 = *pbVar1 | '\x01' << (sbyte)uVar8;
  this->size_ = this->size_ + 1;
  puVar2 = (this->ptrs_).
           super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (*(long *)((long)&(puVar2->_M_t).
                       super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_> +
               (pos & 0xfffffffffffffff8)) == 0) {
    puVar11 = (uint8_t *)0x0;
    if (key->begin != key->end) {
      puVar11 = key->end + ~(ulong)key->begin;
    }
    puVar14 = puVar11 + 4;
    lVar6 = 1;
    puVar12 = puVar14;
    if ((uint8_t *)0x7f < puVar14) {
      do {
        lVar6 = lVar6 + 1;
        bVar4 = (uint8_t *)0x3fff < puVar12;
        puVar12 = (uint8_t *)((ulong)puVar12 >> 7);
      } while (bVar4);
    }
    puVar12 = puVar11 + lVar6 + 4;
    this->label_bytes_ = (uint64_t)(puVar12 + this->label_bytes_);
    _Var7.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
         (__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)
         operator_new__((ulong)puVar12);
    memset((void *)_Var7.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                   super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,0,(size_t)puVar12);
    tVar3.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
         *(_Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_> *)
          &puVar2[chunk_id]._M_t.
           super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>;
    puVar2[chunk_id]._M_t.
    super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_> =
         _Var7.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
         super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    if (tVar3.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
        super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl !=
        (_Head_base<0UL,_unsigned_char_*,_false>)0x0) {
      operator_delete__((void *)tVar3.
                                super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
    }
    _Var7.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
         (this->ptrs_).
         super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[chunk_id]._M_t.
         super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>;
    lVar6 = 0;
    puVar12 = puVar14;
    if ((uint8_t *)0x7f < puVar14) {
      do {
        *(byte *)((long)_Var7.
                        super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                        .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + lVar6) =
             (byte)puVar12 | 0x80;
        lVar6 = lVar6 + 1;
        puVar14 = (uint8_t *)((ulong)puVar12 >> 7);
        bVar4 = (uint8_t *)0x3fff < puVar12;
        puVar12 = puVar14;
      } while (bVar4);
    }
    lVar6 = (long)_Var7.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + 1 + lVar6;
    *(char *)(lVar6 + -1) = (char)puVar14;
    if (puVar11 != (uint8_t *)0x0) {
      puVar14 = key->begin;
      puVar12 = (uint8_t *)0x0;
      do {
        puVar12[lVar6] = puVar12[(long)puVar14];
        puVar12 = puVar12 + 1;
      } while (puVar11 != puVar12);
    }
    pvVar15 = (value_type_conflict7 *)(puVar11 + lVar6);
    puVar11 = puVar11 + lVar6;
    puVar11[0] = '\0';
    puVar11[1] = '\0';
    puVar11[2] = '\0';
    puVar11[3] = '\0';
  }
  else {
    pVar16 = get_allocs_(this,chunk_id,(ulong)uVar8);
    uVar9 = pVar16.second;
    uVar5 = pVar16.first;
    puVar14 = key->begin;
    puVar11 = (uint8_t *)0x0;
    if (puVar14 != key->end) {
      puVar11 = key->end + ~(ulong)puVar14;
    }
    puVar12 = puVar11 + 4;
    lVar6 = 1;
    puVar13 = puVar12;
    if ((uint8_t *)0x7f < puVar12) {
      do {
        lVar6 = lVar6 + 1;
        bVar4 = (uint8_t *)0x3fff < puVar13;
        puVar13 = (uint8_t *)((ulong)puVar13 >> 7);
      } while (bVar4);
    }
    this->label_bytes_ = (uint64_t)(puVar11 + this->label_bytes_ + lVar6 + 4);
    __s.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
         (__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)
         operator_new__((ulong)(puVar11 + uVar9 + uVar5 + lVar6 + 4));
    memset((void *)__s.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                   super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,0,
           (size_t)(puVar11 + uVar9 + uVar5 + lVar6 + 4));
    puVar2 = (this->ptrs_).
             super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    _Var7.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
         puVar2[chunk_id]._M_t.
         super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>;
    if (uVar5 != 0) {
      uVar10 = 0;
      do {
        *(undefined1 *)
         ((long)__s.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t
                .super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + uVar10) =
             *(undefined1 *)
              ((long)_Var7.
                     super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                     super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + uVar10);
        uVar10 = uVar10 + 1;
      } while (uVar5 != uVar10);
    }
    lVar6 = 0;
    puVar13 = puVar12;
    if ((uint8_t *)0x7f < puVar12) {
      do {
        *(byte *)((long)__s.
                        super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                        .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + lVar6 + uVar5)
             = (byte)puVar12 | 0x80;
        lVar6 = lVar6 + 1;
        puVar13 = (uint8_t *)((ulong)puVar12 >> 7);
        bVar4 = (uint8_t *)0x3fff < puVar12;
        puVar12 = puVar13;
      } while (bVar4);
    }
    lVar6 = (long)__s.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + lVar6 + uVar5 + 1;
    *(char *)(lVar6 + -1) = (char)puVar13;
    if (puVar11 != (uint8_t *)0x0) {
      puVar12 = (uint8_t *)0x0;
      do {
        puVar12[lVar6] = puVar14[(long)puVar12];
        puVar12 = puVar12 + 1;
      } while (puVar11 != puVar12);
    }
    pvVar15 = (value_type_conflict7 *)(puVar11 + lVar6);
    puVar11 = puVar11 + lVar6;
    puVar11[0] = '\0';
    puVar11[1] = '\0';
    puVar11[2] = '\0';
    puVar11[3] = '\0';
    if (uVar9 != 0) {
      uVar10 = 0;
      do {
        *(undefined1 *)((long)pvVar15 + uVar10 + 4) =
             *(undefined1 *)
              ((long)_Var7.
                     super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                     super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + uVar5 + uVar10);
        uVar10 = uVar10 + 1;
      } while (uVar9 != uVar10);
    }
    tVar3.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
         *(_Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_> *)
          &puVar2[chunk_id]._M_t.
           super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>;
    puVar2[chunk_id]._M_t.
    super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_> =
         __s.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
         super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    if (tVar3.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
        super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl !=
        (_Head_base<0UL,_unsigned_char_*,_false>)0x0) {
      operator_delete__((void *)tVar3.
                                super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
    }
  }
  return pvVar15;
}

Assistant:

value_type* insert(uint64_t pos, const char_range& key) {
        auto [chunk_id, pos_in_chunk] = decompose_value<ChunkSize>(pos);

        assert(!bit_tools::get_bit(chunks_[chunk_id], pos_in_chunk));
        bit_tools::set_bit(chunks_[chunk_id], pos_in_chunk);

        ++size_;

#ifdef POPLAR_EXTRA_STATS
        max_length_ = std::max<uint64_t>(max_length_, key.length());
        sum_length_ += key.length();
#endif

        if (!ptrs_[chunk_id]) {
            // First association in the group
            uint64_t length = key.empty() ? 0 : key.length() - 1;
            uint64_t new_alloc = vbyte::size(length + sizeof(value_type)) + length + sizeof(value_type);
            label_bytes_ += new_alloc;

            ptrs_[chunk_id] = std::make_unique<uint8_t[]>(new_alloc);
            uint8_t* ptr = ptrs_[chunk_id].get();

            ptr += vbyte::encode(ptr, length + sizeof(value_type));
            copy_bytes(ptr, key.begin, length);

            auto ret_ptr = reinterpret_cast<value_type*>(ptr + length);
            *ret_ptr = static_cast<value_type>(0);

            return ret_ptr;
        }

        // Second and subsequent association in the group
        auto fr_alloc = get_allocs_(chunk_id, pos_in_chunk);

        const uint64_t len = key.empty() ? 0 : key.length() - 1;
        const uint64_t new_alloc = vbyte::size(len + sizeof(value_type)) + len + sizeof(value_type);
        label_bytes_ += new_alloc;

        auto new_unique = std::make_unique<uint8_t[]>(fr_alloc.first + new_alloc + fr_alloc.second);

        // Get raw pointers
        const uint8_t* orig_ptr = ptrs_[chunk_id].get();
        uint8_t* new_ptr = new_unique.get();

        // Copy the front allocation
        copy_bytes(new_ptr, orig_ptr, fr_alloc.first);
        orig_ptr += fr_alloc.first;
        new_ptr += fr_alloc.first;

        // Set new allocation
        new_ptr += vbyte::encode(new_ptr, len + sizeof(value_type));
        copy_bytes(new_ptr, key.begin, len);
        new_ptr += len;
        *reinterpret_cast<value_type*>(new_ptr) = static_cast<value_type>(0);

        // Copy the back allocation
        copy_bytes(new_ptr + sizeof(value_type), orig_ptr, fr_alloc.second);

        // Overwrite
        ptrs_[chunk_id] = std::move(new_unique);

        return reinterpret_cast<value_type*>(new_ptr);
    }